

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_test.cc
# Opt level: O1

void __thiscall RandTest_Threads_Test::TestBody(RandTest_Threads_Test *this)

{
  RunConcurrentRands(10);
  RunConcurrentRands(0x14);
  RunConcurrentRands(10);
  return;
}

Assistant:

TEST(RandTest, Threads) {
  constexpr size_t kFewerThreads = 10;
  constexpr size_t kMoreThreads = 20;

  // Draw entropy in parallel.
  RunConcurrentRands(kFewerThreads);
  // Draw entropy in parallel with higher concurrency than the previous maximum.
  RunConcurrentRands(kMoreThreads);
  // Draw entropy in parallel with lower concurrency than the previous maximum.
  RunConcurrentRands(kFewerThreads);
}